

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

deUint32 tcu::packRGB999E5(Vec4 *color)

{
  deInt32 dVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  float *pfVar5;
  float x;
  float x_00;
  float y;
  float fVar6;
  float fVar7;
  int local_58;
  deUint32 bs;
  deUint32 gs;
  deUint32 rs;
  deUint32 exps;
  int maxs;
  float e;
  int expp;
  float maxc;
  float bc;
  float gc;
  float rc;
  float maxVal;
  int eMax;
  int eBias;
  int eBits;
  int mBits;
  Vec4 *color_local;
  
  pfVar5 = Vector<float,_4>::operator[](color,0);
  x = deFloatClamp(*pfVar5,0.0,65408.0);
  pfVar5 = Vector<float,_4>::operator[](color,1);
  x_00 = deFloatClamp(*pfVar5,0.0,65408.0);
  pfVar5 = Vector<float,_4>::operator[](color,2);
  y = deFloatClamp(*pfVar5,0.0,65408.0);
  fVar6 = de::max<float>(x_00,y);
  fVar6 = de::max<float>(x,fVar6);
  fVar7 = deFloatLog2(fVar6);
  dVar1 = deFloorFloatToInt32(fVar7);
  iVar2 = de::max<int>(-0x10,dVar1);
  local_58 = iVar2 + 0x10;
  fVar7 = deFloatPow(2.0,(float)(iVar2 + -8));
  dVar1 = deFloorFloatToInt32(fVar6 / fVar7 + 0.5);
  if (dVar1 == 0x200) {
    local_58 = iVar2 + 0x11;
  }
  dVar1 = deFloorFloatToInt32(x / fVar7 + 0.5);
  uVar3 = deClamp32(dVar1,0,0x1ff);
  dVar1 = deFloorFloatToInt32(x_00 / fVar7 + 0.5);
  iVar2 = deClamp32(dVar1,0,0x1ff);
  dVar1 = deFloorFloatToInt32(y / fVar7 + 0.5);
  iVar4 = deClamp32(dVar1,0,0x1ff);
  return uVar3 | iVar2 << 9 | iVar4 << 0x12 | local_58 << 0x1b;
}

Assistant:

deUint32 packRGB999E5 (const tcu::Vec4& color)
{
	const int	mBits	= 9;
	const int	eBits	= 5;
	const int	eBias	= 15;
	const int	eMax	= (1<<eBits)-1;
	const float	maxVal	= (float)(((1<<mBits) - 1) * (1<<(eMax-eBias))) / (float)(1<<mBits);

	float	rc		= deFloatClamp(color[0], 0.0f, maxVal);
	float	gc		= deFloatClamp(color[1], 0.0f, maxVal);
	float	bc		= deFloatClamp(color[2], 0.0f, maxVal);
	float	maxc	= de::max(rc, de::max(gc, bc));
	int		expp	= de::max(-eBias - 1, deFloorFloatToInt32(deFloatLog2(maxc))) + 1 + eBias;
	float	e		= deFloatPow(2.0f, (float)(expp-eBias-mBits));
	int		maxs	= deFloorFloatToInt32(maxc / e + 0.5f);

	deUint32	exps	= maxs == (1<<mBits) ? expp+1 : expp;
	deUint32	rs		= (deUint32)deClamp32(deFloorFloatToInt32(rc / e + 0.5f), 0, (1<<9)-1);
	deUint32	gs		= (deUint32)deClamp32(deFloorFloatToInt32(gc / e + 0.5f), 0, (1<<9)-1);
	deUint32	bs		= (deUint32)deClamp32(deFloorFloatToInt32(bc / e + 0.5f), 0, (1<<9)-1);

	DE_ASSERT((exps & ~((1<<5)-1)) == 0);
	DE_ASSERT((rs & ~((1<<9)-1)) == 0);
	DE_ASSERT((gs & ~((1<<9)-1)) == 0);
	DE_ASSERT((bs & ~((1<<9)-1)) == 0);

	return rs | (gs << 9) | (bs << 18) | (exps << 27);
}